

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Osc::renderSin(V2Osc *this,float *dest,int nsamples)

{
  float fVar1;
  float fVar2;
  uint local_24;
  float t;
  uint32_t phase;
  int i;
  int nsamples_local;
  float *dest_local;
  V2Osc *this_local;
  
  for (t = 0.0; (int)t < nsamples; t = (float)((int)t + 1)) {
    local_24 = this->cnt + 0x40000000;
    this->cnt = this->freq + this->cnt;
    if ((local_24 & 0x80000000) != 0) {
      local_24 = local_24 ^ 0xffffffff;
    }
    fVar2 = bits2float(local_24 >> 8 | 0x3f800000);
    fVar1 = this->gain;
    fVar2 = fastsin(fVar2 * 3.1415927 + -4.712389);
    output(this,dest + (int)t,fVar1 * fVar2);
  }
  return;
}

Assistant:

void renderSin(float *dest, int nsamples)
    {
        COVER("Osc sin");

        // Sine is already a perfectly bandlimited waveform, so we needn't
        // worry about aliasing here.
        for (int i=0; i < nsamples; i++)
        {
            // Brace yourselves: The name is a lie! It's actually a cosine wave!
            uint32_t phase = cnt + 0x40000000; // quarter-turn (pi/2) phase offset
            cnt += freq; // step the oscillator

            // range reduce to [0,pi]
            if (phase & 0x80000000) // Symmetry: cos(x) = cos(-x)
                phase = ~phase; // V2 uses ~ not - which is slightly off but who cares

            // convert to t in [1,2)
            float t = bits2float((phase >> 8) | 0x3f800000); // 1.0f + (phase / (2^31))

            // and then to t in [-pi/2,pi/2)
            // i know the V2 ASM code says "scale/move to (-pi/4 .. pi/4)".
            // trust me, it's lying.
            t = t * fcpi - fc1p5pi;

            output(dest + i, gain * fastsin(t));
        }
    }